

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scenegraph.h
# Opt level: O0

void __thiscall
embree::SceneGraph::MultiTransformNode::setMaterial
          (MultiTransformNode *this,Ref<embree::SceneGraph::MaterialNode> *material)

{
  long *plVar1;
  long *in_RSI;
  long in_RDI;
  long *local_40 [3];
  undefined8 *local_28;
  long **local_18;
  long **local_10;
  
  local_28 = (undefined8 *)(in_RDI + 0x80);
  plVar1 = (long *)*local_28;
  local_18 = local_40;
  local_40[0] = (long *)*in_RSI;
  if (local_40[0] != (long *)0x0) {
    (**(code **)(*local_40[0] + 0x10))();
  }
  (**(code **)(*plVar1 + 0x28))(plVar1,local_40);
  local_10 = local_40;
  if (local_40[0] != (long *)0x0) {
    (**(code **)(*local_40[0] + 0x18))();
  }
  return;
}

Assistant:

virtual void setMaterial(Ref<MaterialNode> material) {
        child->setMaterial(material);
      }